

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFInterpolater.cpp
# Opt level: O1

void __thiscall
amrex::MFPCInterp::interp
          (MFPCInterp *this,MultiFab *crsemf,int ccomp,MultiFab *finemf,int fcomp,int nc,IntVect *ng
          ,Geometry *param_7,Geometry *param_8,Box *dest_domain,IntVect *ratio,
          Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *param_11,int param_12)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  bool bVar21;
  MFIter mfi;
  ulong local_1b8;
  long local_1a8;
  Box local_12c;
  Array4<const_double> local_110;
  Array4<double> local_d0;
  MFIter local_90;
  
  MFIter::MFIter(&local_90,(FabArrayBase *)finemf,'\0');
  if (local_90.currentIndex < local_90.endIndex) {
    do {
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_d0,&finemf->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_110,&crsemf->super_FabArray<amrex::FArrayBox>,&local_90);
      BATransformer::operator()
                (&local_12c,&((local_90.fabArray)->boxarray).m_bat,
                 (Box *)((long)((local_90.index_map)->super_vector<int,_std::allocator<int>_>).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[local_90.currentIndex] * 0x1c +
                        *(long *)&((((local_90.fabArray)->boxarray).m_ref.
                                    super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->m_abox).
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data));
      uVar8 = local_12c.smallend.vect[2] - ng->vect[2];
      uVar1 = (dest_domain->smallend).vect[2];
      if ((int)uVar8 <= (int)uVar1) {
        uVar8 = uVar1;
      }
      if (0 < nc) {
        uVar9 = ng->vect[2] + local_12c.bigend.vect[2];
        uVar1 = (dest_domain->bigend).vect[2];
        if ((int)uVar1 <= (int)uVar9) {
          uVar9 = uVar1;
        }
        iVar2 = (dest_domain->smallend).vect[0];
        iVar14 = local_12c.smallend.vect[1] - ng->vect[1];
        iVar16 = ng->vect[1] + local_12c.bigend.vect[1];
        iVar3 = (dest_domain->bigend).vect[1];
        if (iVar3 <= iVar16) {
          iVar16 = iVar3;
        }
        iVar3 = (dest_domain->smallend).vect[1];
        iVar18 = local_12c.smallend.vect[0] - ng->vect[0];
        iVar20 = ng->vect[0] + local_12c.bigend.vect[0];
        iVar5 = (dest_domain->bigend).vect[0];
        if (iVar5 <= iVar20) {
          iVar20 = iVar5;
        }
        if (iVar14 <= iVar3) {
          iVar14 = iVar3;
        }
        if (iVar18 <= iVar2) {
          iVar18 = iVar2;
        }
        iVar2 = ratio->vect[2];
        local_1b8 = 0;
        local_1a8 = (long)fcomp << 3;
        do {
          if ((int)uVar8 <= (int)uVar9) {
            iVar3 = ratio->vect[1];
            uVar1 = uVar8;
            do {
              uVar4 = uVar1;
              if (iVar2 != 1) {
                if (iVar2 == 4) {
                  if ((int)uVar1 < 0) {
                    uVar11 = uVar1 + 1;
                    uVar4 = -uVar11;
                    if (0 < (int)uVar11) {
                      uVar4 = uVar11;
                    }
                    uVar4 = uVar4 >> 2;
                    goto LAB_004c4c05;
                  }
                  uVar4 = uVar1 >> 2;
                }
                else if (iVar2 == 2) {
                  if ((int)uVar1 < 0) {
                    uVar11 = uVar1 + 1;
                    uVar4 = -uVar11;
                    if (0 < (int)uVar11) {
                      uVar4 = uVar11;
                    }
                    uVar4 = uVar4 >> 1;
LAB_004c4c05:
                    uVar4 = ~uVar4;
                  }
                  else {
                    uVar4 = uVar1 >> 1;
                  }
                }
                else {
                  if ((int)uVar1 < 0) {
                    iVar10 = uVar1 + 1;
                    iVar5 = -iVar10;
                    if (0 < iVar10) {
                      iVar5 = iVar10;
                    }
                    uVar4 = iVar5 / iVar2;
                    goto LAB_004c4c05;
                  }
                  uVar4 = (int)uVar1 / iVar2;
                }
              }
              if (iVar14 <= iVar16) {
                iVar5 = ratio->vect[0];
                lVar13 = (long)local_d0.p +
                         local_d0.nstride * local_1a8 +
                         ((long)iVar14 - (long)local_d0.begin.y) * local_d0.jstride * 8 +
                         ((long)(int)uVar1 - (long)local_d0.begin.z) * local_d0.kstride * 8 +
                         (long)local_d0.begin.x * -8 + (long)iVar18 * 8;
                uVar15 = (long)iVar14;
                do {
                  uVar11 = (uint)uVar15;
                  if (iVar3 != 1) {
                    if (iVar3 == 4) {
                      if ((long)uVar15 < 0) {
                        uVar11 = uVar11 + 1;
                        uVar7 = -uVar11;
                        if (0 < (int)uVar11) {
                          uVar7 = uVar11;
                        }
                        uVar7 = uVar7 >> 2;
                        goto LAB_004c4d62;
                      }
                      uVar11 = (uint)(uVar15 >> 2) & 0x3fffffff;
                    }
                    else if (iVar3 == 2) {
                      if ((long)uVar15 < 0) {
                        uVar11 = uVar11 + 1;
                        uVar7 = -uVar11;
                        if (0 < (int)uVar11) {
                          uVar7 = uVar11;
                        }
                        uVar7 = uVar7 >> 1;
LAB_004c4d62:
                        uVar11 = ~uVar7;
                      }
                      else {
                        uVar11 = (uint)(uVar15 >> 1) & 0x7fffffff;
                      }
                    }
                    else {
                      if ((long)uVar15 < 0) {
                        iVar12 = uVar11 + 1;
                        iVar10 = -iVar12;
                        if (0 < iVar12) {
                          iVar10 = iVar12;
                        }
                        uVar7 = iVar10 / iVar3;
                        goto LAB_004c4d62;
                      }
                      uVar11 = (uint)((long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 |
                                            uVar15 & 0xffffffff) / (long)iVar3);
                    }
                  }
                  if (iVar18 <= iVar20) {
                    lVar19 = 0;
                    uVar17 = (long)iVar18;
                    do {
                      uVar7 = (uint)uVar17;
                      if (iVar5 == 4) {
                        if ((long)uVar17 < 0) {
                          uVar7 = uVar7 + 1;
                          uVar6 = -uVar7;
                          if (0 < (int)uVar7) {
                            uVar6 = uVar7;
                          }
                          uVar7 = uVar6 >> 2;
LAB_004c4df9:
                          uVar7 = ~uVar7;
                        }
                        else {
                          uVar7 = (uint)(uVar17 >> 2) & 0x3fffffff;
                        }
                      }
                      else if (iVar5 == 2) {
                        if ((long)uVar17 < 0) {
                          uVar7 = uVar7 + 1;
                          uVar6 = -uVar7;
                          if (0 < (int)uVar7) {
                            uVar6 = uVar7;
                          }
                          uVar7 = uVar6 >> 1;
                          goto LAB_004c4df9;
                        }
                        uVar7 = (uint)(uVar17 >> 1) & 0x7fffffff;
                      }
                      else if (iVar5 != 1) {
                        if ((long)uVar17 < 0) {
                          iVar12 = uVar7 + 1;
                          iVar10 = -iVar12;
                          if (0 < iVar12) {
                            iVar10 = iVar12;
                          }
                          uVar7 = iVar10 / iVar5;
                          goto LAB_004c4df9;
                        }
                        uVar7 = (uint)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 |
                                             uVar17 & 0xffffffff) / (long)iVar5);
                      }
                      *(double *)(lVar13 + lVar19 * 8) =
                           local_110.p
                           [((long)(int)uVar4 - (long)local_110.begin.z) * local_110.kstride +
                            local_110.nstride * ((long)ccomp + local_1b8) +
                            ((long)(int)uVar11 - (long)local_110.begin.y) * local_110.jstride +
                            ((long)(int)uVar7 - (long)local_110.begin.x)];
                      uVar17 = uVar17 + 1;
                      lVar19 = lVar19 + 1;
                    } while ((iVar20 - iVar18) + 1 != (int)lVar19);
                  }
                  uVar15 = uVar15 + 1;
                  lVar13 = lVar13 + local_d0.jstride * 8;
                } while (iVar16 + 1 != (int)uVar15);
              }
              bVar21 = uVar1 != uVar9;
              uVar1 = uVar1 + 1;
            } while (bVar21);
          }
          local_1b8 = local_1b8 + 1;
          local_1a8 = local_1a8 + 8;
        } while (local_1b8 != (uint)nc);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
MFPCInterp::interp (MultiFab const& crsemf, int ccomp, MultiFab& finemf, int fcomp, int nc,
                    IntVect const& ng, Geometry const&, Geometry const&,
                    Box const& dest_domain, IntVect const& ratio,
                    Vector<BCRec> const&, int)
{
    AMREX_ASSERT(crsemf.nGrowVect() == 0);

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        auto const& crse = crsemf.const_arrays();
        auto const& fine = finemf.arrays();
        ParallelFor(finemf, ng, nc,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            if (dest_domain.contains(i,j,k)) {
                AMREX_D_TERM(int ic = amrex::coarsen(i,ratio[0]);,
                             int jc = amrex::coarsen(j,ratio[1]);,
                             int kc = amrex::coarsen(k,ratio[2]);)
                AMREX_D_PICK(fine[box_no](i,0,0,n+fcomp) = crse[box_no](ic, 0, 0,n+ccomp);,
                             fine[box_no](i,j,0,n+fcomp) = crse[box_no](ic,jc, 0,n+ccomp);,
                             fine[box_no](i,j,k,n+fcomp) = crse[box_no](ic,jc,kc,n+ccomp);)
            }
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(finemf); mfi.isValid(); ++mfi) {
            auto const& fine = finemf.array(mfi);
            auto const& crse = crsemf.const_array(mfi);
            Box const& fbox = amrex::grow(mfi.validbox(), ng) & dest_domain;
            pcinterp_interp(fbox, fine, fcomp, nc, crse, ccomp, ratio);
        }
    }
}